

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

void __thiscall t_swift_generator::init_generator(t_swift_generator *this)

{
  ofstream_with_content_based_conditional_update *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  int iVar6;
  long *plVar7;
  int *piVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  size_type *psVar10;
  long *plVar11;
  t_program *in_RDX;
  string f_impl_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string f_decl_name;
  string f_decl_fullname;
  string module_path;
  string f_impl_fullname;
  string name;
  string module;
  string out_dir;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  char *local_f0;
  long local_e8;
  char local_e0 [16];
  string local_d0;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  get_real_swift_module_abi_cxx11_
            (&local_90,(t_swift_generator *)(this->super_t_oop_generator).super_t_generator.program_
             ,in_RDX);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_50,this);
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_50,local_50 + local_48);
  local_b0 = local_a0;
  pcVar5 = (this->super_t_oop_generator).super_t_generator.program_name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar5,
             pcVar5 + (this->super_t_oop_generator).super_t_generator.program_name_._M_string_length
            );
  if ((this->namespaced_ == true) && (local_90._M_string_length != 0)) {
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_f0,local_f0 + local_e8);
    std::__cxx11::string::append((char *)&local_110);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)local_90._M_dataplus._M_p);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_130.field_2._M_allocated_capacity = *psVar10;
      local_130.field_2._8_8_ = plVar7[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar10;
      local_130._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_130._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    std::__cxx11::string::_M_assign((string *)&local_b0);
  }
  iVar6 = mkdir(local_f0,0x1ff);
  if (iVar6 == -1) {
    piVar8 = __errno_location();
    if (*piVar8 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&local_110,local_f0,(allocator *)&local_170);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_130._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_130._M_dataplus._M_p == psVar10) {
        local_130.field_2._M_allocated_capacity = *psVar10;
        local_130.field_2._8_8_ = plVar7[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar10;
      }
      local_130._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      __rhs = strerror(*piVar8);
      std::operator+(__return_storage_ptr__,&local_130,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  populate_reserved_words(this);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_b0,local_b0 + local_a8);
  std::__cxx11::string::append((char *)&local_130);
  paVar2 = &local_170.field_2;
  local_170._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_f0,local_f0 + local_e8);
  std::__cxx11::string::append((char *)&local_170);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_170,(ulong)local_130._M_dataplus._M_p);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_100 = *plVar11;
    lStack_f8 = plVar7[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar11;
    local_110 = (long *)*plVar7;
  }
  local_108 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_170,(char *)local_110,(allocator *)&local_d0);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_decl_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>
              .field_0x70);
  poVar1 = &this->f_decl_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (poVar1);
  (this->f_decl_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90
       = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_170,this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_170._M_dataplus._M_p,local_170._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  swift_imports_abi_cxx11_(&local_170,this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_170._M_dataplus._M_p,local_170._M_string_length);
  swift_thrift_imports_abi_cxx11_(&local_d0,this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar4 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar4) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  local_170._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_b0,local_b0 + local_a8);
  std::__cxx11::string::append((char *)&local_170);
  paVar3 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_f0,local_f0 + local_e8);
  std::__cxx11::string::append((char *)&local_150);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_150,(ulong)local_170._M_dataplus._M_p);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_d0.field_2._M_allocated_capacity = *psVar10;
    local_d0.field_2._8_8_ = plVar7[3];
    local_d0._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar10;
    local_d0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar3) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  std::__cxx11::string::string
            ((string *)&local_150,local_d0._M_dataplus._M_p,(allocator *)&local_70);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_impl_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>
              .field_0x70);
  poVar1 = &this->f_impl_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (poVar1);
  (this->f_impl_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90
       = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar3) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_150,this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar3) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  swift_imports_abi_cxx11_(&local_150,this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_150._M_dataplus._M_p,local_150._M_string_length);
  swift_thrift_imports_abi_cxx11_(&local_70,this);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar3) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar4) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_swift_generator::init_generator() {
  // Make output directory
  string module = get_real_swift_module(program_);
  string out_dir = get_out_dir();
  string module_path = out_dir;
  string name = program_name_;
  if (namespaced_ && !module.empty()) {
    module_path = module_path + "/" + module;
    name = module;
  }
  MKDIR(module_path.c_str());

  populate_reserved_words();

  // we have a .swift declarations file...
  string f_decl_name = name + ".swift";
  string f_decl_fullname = module_path + "/" + f_decl_name;
  f_decl_.open(f_decl_fullname.c_str());

  f_decl_ << autogen_comment() << endl;

  f_decl_ << swift_imports() << swift_thrift_imports() << endl;

  // ...and a .swift implementation extensions file
  string f_impl_name = name + "+Exts.swift";
  string f_impl_fullname = module_path + "/" + f_impl_name;
  f_impl_.open(f_impl_fullname.c_str());

  f_impl_ << autogen_comment() << endl;

  f_impl_ << swift_imports() << swift_thrift_imports() << endl;

}